

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersGL<Diligent::RayTracingPipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  long lVar1;
  long lVar2;
  SerializedShaderImpl *pSVar3;
  pointer pSVar4;
  undefined4 uVar5;
  pointer pSVar6;
  undefined4 *puVar7;
  char (*in_RCX) [42];
  pointer Args_1;
  pointer pSVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  pointer pSVar13;
  undefined1 *puVar14;
  _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  *this_00;
  bool bVar15;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ShaderStages;
  SHADER_TYPE ActiveShaderStages;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  anon_class_32_4_a6542874 AddShader;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  local_138;
  SHADER_TYPE local_114;
  SerializedPipelineStateImpl *local_110;
  undefined1 local_108 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_e8;
  char *local_e0;
  ShaderMacro *pSStack_d8;
  Uint32 local_d0;
  undefined8 local_cc;
  undefined8 uStack_c4;
  undefined8 local_bc;
  undefined4 local_b4;
  SHADER_SOURCE_LANGUAGE local_b0;
  SHADER_COMPILER local_ac;
  ShaderVersion local_a8;
  ShaderVersion SStack_a0;
  ShaderVersion local_98;
  ShaderVersion SStack_90;
  undefined8 local_88;
  char *pcStack_80;
  char *local_78;
  anon_class_32_4_a6542874 local_70;
  string local_50;
  
  local_138.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_114 = SHADER_TYPE_UNKNOWN;
  pcVar10 = (char *)CreateInfo;
  local_110 = this;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)local_108,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",in_RCX);
    pcVar10 = "ExtractShaders";
    DebugAssertionFailed
              ((Char *)local_108._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      pcVar10 = (char *)(local_108._16_8_ + 1);
      operator_delete((void *)local_108._0_8_,(ulong)pcVar10);
    }
  }
  local_108._0_8_ = &pSStack_d8;
  local_108._8_8_ = (IShaderSourceInputStreamFactory *)0x1;
  local_108._16_8_ = 0;
  local_108._24_8_ = 0;
  local_e8.SourceLength._0_4_ = 1.0;
  local_e0 = (char *)0x0;
  pSStack_d8 = (ShaderMacro *)0x0;
  local_70.UniqueShaders =
       (unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
        *)local_108;
  local_70.ActiveShaderStages = &local_114;
  local_70.WaitUntilShadersReady = true;
  if (local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_138.
    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_138.
         super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar11 = (long)local_138.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_138.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pSVar13 = (pointer)(lVar11 >> 4);
  if (pSVar13 < (pointer)0x6) {
    pSVar8 = (pointer)(6 - (long)pSVar13);
    Args_1 = (pointer)((long)local_138.
                             super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                       (long)local_138.
                             super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                             ._M_impl.super__Vector_impl_data._M_finish >> 4);
    if (Args_1 < pSVar8) {
      if ((pointer)(0x7ffffffffffffff - (long)pSVar13) < pSVar8) {
        local_70.ShaderStages = &local_138;
        std::__throw_length_error("vector::_M_default_append");
      }
      pSVar6 = pSVar8;
      if (pSVar8 < pSVar13) {
        pSVar6 = pSVar13;
      }
      this_00 = (_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 *)((long)&pSVar13->Type + (long)&pSVar6->Type);
      if ((_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
           *)0x7fffffffffffffe < this_00) {
        this_00 = (_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                   *)0x7ffffffffffffff;
      }
      Args_1 = (pointer)((long)&pSVar13->Type + (long)&pSVar6->Type);
      if (CARRY8((ulong)pSVar6,(ulong)pSVar13)) {
        this_00 = (_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                   *)0x7ffffffffffffff;
      }
      local_70.ShaderStages = &local_138;
      pSVar6 = std::
               _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
               ::_M_allocate(this_00,(size_t)pcVar10);
      puVar14 = (undefined1 *)((long)&pSVar13[-1].pShader + 2);
      puVar7 = (undefined4 *)(lVar11 + (long)pSVar6);
      do {
        *puVar7 = 0;
        *(undefined8 *)(puVar7 + 2) = 0;
        puVar7 = puVar7 + 4;
        puVar14 = puVar14 + 1;
        pSVar13 = pSVar6;
        pSVar4 = local_138.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (puVar14 != (undefined1 *)0x0);
      for (; pSVar4 != local_138.
                       super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pSVar4 = pSVar4 + 1) {
        uVar5 = *(undefined4 *)&pSVar4->field_0x4;
        pSVar3 = pSVar4->pShader;
        pSVar13->Type = pSVar4->Type;
        *(undefined4 *)&pSVar13->field_0x4 = uVar5;
        pSVar13->pShader = pSVar3;
        Args_1 = pSVar13 + 1;
        pSVar13 = Args_1;
      }
      if (local_138.
          super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.
                        super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_138.
                              super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.
                              super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar6 + (long)this_00;
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar6;
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((undefined4 *)(lVar11 + (long)pSVar6) + (long)pSVar8 * 4);
    }
    else {
      puVar14 = (undefined1 *)((long)&pSVar13[-1].pShader + 2);
      do {
        (local_138.
         super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
         ._M_impl.super__Vector_impl_data._M_finish)->Type = SHADER_TYPE_UNKNOWN;
        (local_138.
         super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
         ._M_impl.super__Vector_impl_data._M_finish)->pShader = (SerializedShaderImpl *)0x0;
        local_138.
        super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_138.
             super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        puVar14 = puVar14 + 1;
        local_70.ShaderStages = &local_138;
      } while (puVar14 != (undefined1 *)0x0);
    }
  }
  else {
    Args_1 = local_138.
             super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_70.ShaderStages = &local_138;
    if ((lVar11 != 0x60) &&
       (Args_1 = local_138.
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6, local_70.ShaderStages = &local_138,
       local_138.
       super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
       ._M_impl.super__Vector_impl_data._M_finish != Args_1)) {
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish = Args_1;
      local_70.ShaderStages = &local_138;
    }
  }
  local_114 = SHADER_TYPE_UNKNOWN;
  if (CreateInfo->GeneralShaderCount != 0) {
    lVar11 = 8;
    uVar12 = 0;
    do {
      PipelineStateUtils::
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_70,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar11));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (uVar12 < CreateInfo->GeneralShaderCount);
  }
  if (CreateInfo->TriangleHitShaderCount != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      PipelineStateUtils::
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_70,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar11));
      PipelineStateUtils::
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_70,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar11));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x18;
    } while (uVar12 < CreateInfo->TriangleHitShaderCount);
  }
  if (CreateInfo->ProceduralHitShaderCount != 0) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      PipelineStateUtils::
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_70,
                 *(IShader **)
                  ((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar11));
      PipelineStateUtils::
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_70,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar11)
                );
      PipelineStateUtils::
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_70,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar11));
      uVar12 = uVar12 + 1;
      lVar11 = lVar11 + 0x20;
    } while (uVar12 < CreateInfo->ProceduralHitShaderCount);
  }
  GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  if (local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[22]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x151);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_108);
  if ((local_110->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_110->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              ((string *)local_108,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty()",
               (char (*) [64])local_110);
    DebugAssertionFailed
              ((Char *)local_108._0_8_,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x222);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
  }
  if (local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar10 = (char *)0x0;
  }
  else {
    lVar11 = 8;
    pcVar9 = (char *)0x0;
    do {
      lVar1 = *(long *)((long)&(local_138.
                                super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Type + lVar11);
      lVar2 = *(long *)(lVar1 + 200);
      local_108._8_8_ = *(size_type *)(lVar1 + 0x20);
      bVar15 = *(char *)(lVar2 + 0x118) != '\0';
      local_108._16_8_ = *(size_type *)(lVar2 + 0xf0);
      local_b0 = *(SHADER_SOURCE_LANGUAGE *)(lVar1 + 0x70);
      if (bVar15) {
        local_b0 = SHADER_SOURCE_LANGUAGE_GLSL;
      }
      local_e8 = *(anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 *)(lVar2 + 0xf8);
      local_e0 = *(char **)(lVar1 + 0x40);
      if (bVar15) {
        local_e0 = "main";
      }
      local_108._0_8_ = (ShaderMacro **)0x0;
      local_108._24_8_ = 0;
      pSStack_d8 = (ShaderMacro *)0x0;
      local_d0 = 0;
      local_cc = *(undefined8 *)(lVar1 + 0x54);
      uStack_c4 = *(undefined8 *)(lVar1 + 0x5c);
      local_bc = *(undefined8 *)(lVar1 + 100);
      local_b4 = *(undefined4 *)(lVar1 + 0x6c);
      local_ac = SHADER_COMPILER_DEFAULT;
      local_a8 = *(ShaderVersion *)(lVar1 + 0x78);
      SStack_a0 = *(ShaderVersion *)(lVar1 + 0x80);
      local_98 = *(ShaderVersion *)(lVar1 + 0x88);
      SStack_90 = *(ShaderVersion *)(lVar1 + 0x90);
      local_88 = *(undefined8 *)(lVar1 + 0x98);
      pcStack_80 = *(char **)(lVar1 + 0xa0);
      local_78 = *(char **)(lVar1 + 0xa8);
      SerializeShaderCreateInfo(local_110,OpenGL,(ShaderCreateInfo *)local_108);
      pcVar9 = pcVar9 + 1;
      pcVar10 = (char *)((long)local_138.
                               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_138.
                               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      lVar11 = lVar11 + 0x10;
    } while (pcVar9 < pcVar10);
  }
  if (((long)(local_110->m_Data).Shaders._M_elems[0].
             super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(local_110->m_Data).Shaders._M_elems[0].
             super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 - (long)pcVar10
      != 0) {
    FormatString<char[26],char[86]>
              ((string *)local_108,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size()"
               ,(char (*) [86])pcVar10);
    DebugAssertionFailed
              ((Char *)local_108._0_8_,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x22c);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
  }
  if (local_138.
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoGL> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty());
    for (size_t i = 0; i < ShaderStages.size(); ++i)
    {
        const auto& Stage             = ShaderStages[i];
        const auto& CI                = Stage.pShader->GetCreateInfo();
        const auto* pCompiledShaderGL = Stage.pShader->GetShader<CompiledShaderGL>(DeviceObjectArchive::DeviceType::OpenGL);
        const auto  SerCI             = pCompiledShaderGL->GetSerializationCI(CI);

        SerializeShaderCreateInfo(DeviceType::OpenGL, SerCI);
    }
    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size());
}